

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O3

bool __thiscall
pbrt::Curve::IntersectRay(Curve *this,Ray *r,Float tMax,optional<pbrt::ShapeIntersection> *si)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Transform *this_00;
  CurveCommon *pCVar3;
  bool bVar4;
  float fVar5;
  undefined8 uVar6;
  byte bVar7;
  long lVar8;
  bool bVar9;
  int iVar10;
  Float *pFVar11;
  size_t in_RCX;
  ulong uVar12;
  ulong uVar13;
  uint depth;
  long in_FS_OFFSET;
  undefined8 uVar14;
  byte bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar24 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar46 [48];
  undefined1 auVar34 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar36 [64];
  undefined1 auVar38 [64];
  undefined1 auVar40 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  float fVar47;
  Interval<float> i;
  Interval<float> i_00;
  Interval<float> i_01;
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  undefined1 auVar62 [16];
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  span<const_pbrt::Point3<float>_> cp_00;
  span<const_pbrt::Point3<float>_> cp_01;
  array<pbrt::Point3<float>,_4> cp;
  array<pbrt::Point3<float>,_4> cpObj;
  Transform rayFromObject;
  Tuple3<pbrt::Vector3,_float> local_210;
  Ray local_200;
  Tuple3<pbrt::Point3,_float> local_1d8;
  ulong local_1cc;
  uint local_1c4;
  undefined8 local_1c0;
  undefined4 local_1b8;
  undefined8 local_1b4;
  float local_1ac;
  array<pbrt::Point3<float>,_4> local_1a8;
  undefined1 auStack_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [12];
  float fStack_11c;
  Interval<float> IStack_118;
  Float FStack_110;
  Float FStack_10c;
  Float FStack_108;
  float fStack_104;
  Float FStack_100;
  float fStack_fc;
  Float FStack_f8;
  float fStack_f4;
  Float FStack_f0;
  float fStack_ec;
  Interval<float> IStack_d8;
  Float aFStack_d0 [2];
  Float aFStack_c8 [2];
  Float aFStack_c0 [2];
  Float aFStack_b8 [2];
  Float aFStack_b0 [2];
  undefined1 local_a8 [24];
  Float aFStack_90 [2];
  Float aFStack_88 [2];
  Float aFStack_80 [2];
  Float aFStack_78 [2];
  Float aFStack_70 [2];
  Float local_68 [2];
  Float aFStack_60 [14];
  undefined1 auVar42 [64];
  undefined1 auVar35 [64];
  undefined1 auVar37 [64];
  undefined1 auVar29 [16];
  undefined1 auVar39 [64];
  undefined1 auVar41 [64];
  undefined1 auVar45 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  auVar46 = in_ZmmResult._16_48_;
  *(long *)(in_FS_OFFSET + -0x488) = *(long *)(in_FS_OFFSET + -0x488) + 1;
  fVar61 = (r->o).super_Tuple3<pbrt::Point3,_float>.x;
  auVar16._4_4_ = fVar61;
  auVar16._0_4_ = fVar61;
  auVar16._8_4_ = fVar61;
  auVar16._12_4_ = fVar61;
  fVar61 = (r->o).super_Tuple3<pbrt::Point3,_float>.y;
  auVar19._4_4_ = fVar61;
  auVar19._0_4_ = fVar61;
  auVar19._8_4_ = fVar61;
  auVar19._12_4_ = fVar61;
  fVar61 = (r->o).super_Tuple3<pbrt::Point3,_float>.z;
  auVar17._4_4_ = fVar61;
  auVar17._0_4_ = fVar61;
  auVar17._8_4_ = fVar61;
  auVar17._12_4_ = fVar61;
  this_00 = this->common->objectFromRender;
  local_a8._0_16_ = vmovlhps_avx(auVar16,auVar19);
  local_a8._16_8_ = vmovlps_avx(auVar17);
  Transform::operator()((Point3fi *)local_128,this_00,(Point3fi *)local_a8);
  fVar61 = (r->d).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar53 = (r->d).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar47 = (r->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar61 * (this_00->m).m[1][1])),ZEXT416((uint)fVar53),
                            ZEXT416((uint)(this_00->m).m[1][0]));
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar61 * (this_00->m).m[0][1])),ZEXT416((uint)fVar53),
                            ZEXT416((uint)(this_00->m).m[0][0]));
  auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar61 * (this_00->m).m[2][1])),ZEXT416((uint)fVar53),
                            ZEXT416((uint)(this_00->m).m[2][0]));
  local_148 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar47),ZEXT416((uint)(this_00->m).m[1][2]));
  local_138 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar47),ZEXT416((uint)(this_00->m).m[0][2]));
  local_158 = vfmadd231ss_fma(auVar22,ZEXT416((uint)fVar47),ZEXT416((uint)(this_00->m).m[2][2]));
  auVar22._0_12_ = ZEXT812(0);
  auVar22._12_4_ = 0;
  fVar61 = local_148._0_4_;
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar61 * fVar61)),local_138,local_138);
  auVar16 = vfmadd231ss_fma(auVar16,local_158,local_158);
  if (auVar16._0_4_ <= 0.0) {
    auVar18._4_4_ = IStack_118.high;
    auVar18._0_4_ = IStack_118.low;
    auVar18._8_8_ = 0;
  }
  else {
    auVar20._8_4_ = 0x7fffffff;
    auVar20._0_8_ = 0x7fffffff7fffffff;
    auVar20._12_4_ = 0x7fffffff;
    auVar19 = vandps_avx(local_148,auVar20);
    auVar17 = vandps_avx(local_138,auVar20);
    auVar18 = vandps_avx(local_158,auVar20);
    auVar19 = vfmadd231ss_fma(ZEXT416((uint)(auVar19._0_4_ * 0.0)),auVar22,auVar17);
    auVar19 = vfmadd231ss_fma(auVar19,auVar22,auVar18);
    fVar47 = auVar19._0_4_ / auVar16._0_4_;
    fVar53 = local_138._0_4_ * fVar47;
    local_168 = ZEXT416((uint)(local_158._0_4_ * fVar47));
    i.high = fVar53;
    i.low = fVar53;
    auStack_178 = ZEXT416((uint)(fVar61 * fVar47));
    auVar48._0_8_ = Interval<float>::operator+<float>((Interval<float> *)local_128,i);
    auVar48._8_56_ = extraout_var;
    uVar14 = vmovlps_avx(auVar48._0_16_);
    local_128._0_4_ = (undefined4)uVar14;
    local_128._4_4_ = (undefined4)((ulong)uVar14 >> 0x20);
    i_00.high = (float)auStack_178._0_4_;
    i_00.low = (float)auStack_178._0_4_;
    auVar49._0_8_ = Interval<float>::operator+<float>((Interval<float> *)(local_128 + 8),i_00);
    auVar49._8_56_ = extraout_var_00;
    uVar14 = vmovlps_avx(auVar49._0_16_);
    local_128._8_4_ = (undefined4)uVar14;
    fStack_11c = (float)((ulong)uVar14 >> 0x20);
    i_01.high = (float)local_168._0_4_;
    i_01.low = (float)local_168._0_4_;
    auVar50._0_8_ = Interval<float>::operator+<float>(&IStack_118,i_01);
    auVar50._8_56_ = extraout_var_01;
    auVar18 = auVar50._0_16_;
  }
  auVar23._4_4_ = local_128._4_4_;
  auVar23._0_4_ = local_128._0_4_;
  auVar23._8_4_ = local_128._8_4_;
  auVar23._12_4_ = fStack_11c;
  auVar16 = vhaddps_avx(auVar18,auVar18);
  local_200.o.super_Tuple3<pbrt::Point3,_float>.z = auVar16._0_4_ * 0.5;
  local_200.time = r->time;
  local_200.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )(r->medium).
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  auVar16 = vinsertps_avx(local_138,local_148,0x10);
  auVar19 = vinsertps_avx(auVar23,ZEXT416((uint)fStack_11c),0x10);
  auVar24._0_4_ = (float)local_128._4_4_ + auVar19._0_4_;
  auVar24._4_4_ = (float)local_128._8_4_ + auVar19._4_4_;
  auVar24._8_4_ = auVar19._8_4_ + 0.0;
  auVar24._12_4_ = auVar19._12_4_ + 0.0;
  auVar21._8_4_ = 0x3f000000;
  auVar21._0_8_ = 0x3f0000003f000000;
  auVar21._12_4_ = 0x3f000000;
  auStack_178 = vmulps_avx512vl(auVar24,auVar21);
  local_168._0_4_ = local_200.o.super_Tuple3<pbrt::Point3,_float>.z;
  local_200.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auStack_178);
  local_200.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar16);
  local_200.d.super_Tuple3<pbrt::Vector3,_float>.z = local_158._0_4_;
  cp_00.n = in_RCX;
  cp_00.ptr = (Point3<float> *)&DAT_00000004;
  CubicBezierControlPoints<pbrt::Point3<float>>
            (&local_1a8,(pbrt *)this->common->cpObj,cp_00,this->uMin,this->uMax);
  fVar53 = local_1a8.values[3].super_Tuple3<pbrt::Point3,_float>.y -
           local_1a8.values[0].super_Tuple3<pbrt::Point3,_float>.y;
  fVar47 = local_1a8.values[3].super_Tuple3<pbrt::Point3,_float>.z -
           local_1a8.values[0].super_Tuple3<pbrt::Point3,_float>.z;
  fVar5 = local_1a8.values[3].super_Tuple3<pbrt::Point3,_float>.x -
          local_1a8.values[0].super_Tuple3<pbrt::Point3,_float>.x;
  fVar63 = local_158._0_4_;
  auVar16 = vfmsub213ss_fma(ZEXT416((uint)fVar47),local_148,ZEXT416((uint)(fVar63 * fVar53)));
  auVar19 = vfnmadd231ss_fma(ZEXT416((uint)(fVar63 * fVar53)),local_158,ZEXT416((uint)fVar53));
  fVar61 = auVar16._0_4_ + auVar19._0_4_;
  fVar57 = local_138._0_4_;
  auVar16 = vfmsub213ss_fma(ZEXT416((uint)fVar5),local_158,ZEXT416((uint)(fVar47 * fVar57)));
  auVar22 = vfnmadd213ss_fma(ZEXT416((uint)fVar47),local_138,ZEXT416((uint)(fVar47 * fVar57)));
  fVar47 = local_148._0_4_;
  auVar19 = vfmsub213ss_fma(ZEXT416((uint)fVar53),local_138,ZEXT416((uint)(fVar5 * fVar47)));
  auVar17 = vfnmadd213ss_fma(ZEXT416((uint)fVar5),local_148,ZEXT416((uint)(fVar5 * fVar47)));
  fVar53 = auVar16._0_4_ + auVar22._0_4_;
  auVar16 = vinsertps_avx(ZEXT416((uint)fVar61),ZEXT416((uint)fVar53),0x10);
  local_210.z = auVar17._0_4_ + auVar19._0_4_;
  local_210._0_8_ = vmovlps_avx(auVar16);
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar53 * fVar53)),ZEXT416((uint)fVar61),
                            ZEXT416((uint)fVar61));
  auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)local_210.z),ZEXT416((uint)local_210.z));
  if ((auVar16._0_4_ == 0.0) && (!NAN(auVar16._0_4_))) {
    auVar25._8_4_ = 0x3f800000;
    auVar25._0_8_ = 0x3f8000003f800000;
    auVar25._12_4_ = 0x3f800000;
    auVar26._8_4_ = 0x80000000;
    auVar26._0_8_ = 0x8000000080000000;
    auVar26._12_4_ = 0x80000000;
    auVar16 = vpternlogd_avx512vl(auVar25,local_158,auVar26,0xf8);
    fVar61 = auVar16._0_4_;
    local_210.z = fVar57 * -fVar61;
    fVar53 = -1.0 / (fVar63 + fVar61);
    auVar16 = vfmadd213ss_fma(ZEXT416((uint)(fVar57 * fVar61 * fVar57)),ZEXT416((uint)fVar53),
                              auVar25);
    local_210.y = fVar61 * fVar47 * fVar57 * fVar53;
    local_210.x = auVar16._0_4_;
  }
  auVar16 = vmovshdup_avx(auStack_178);
  auVar16 = vinsertps_avx(ZEXT416((uint)(fVar57 + auStack_178._0_4_)),
                          ZEXT416((uint)(fVar47 + auVar16._0_4_)),0x10);
  uVar14 = vmovlps_avx(auVar16);
  local_a8._8_4_ = fVar63 + (float)local_168._0_4_;
  local_a8._0_8_ = uVar14;
  LookAt((Transform *)local_128,&local_200.o,(Point3f *)local_a8,(Vector3f *)&local_210);
  auVar28._4_4_ = local_1a8.values[0].super_Tuple3<pbrt::Point3,_float>.y;
  auVar28._0_4_ = local_1a8.values[0].super_Tuple3<pbrt::Point3,_float>.y;
  auVar28._8_4_ = local_1a8.values[0].super_Tuple3<pbrt::Point3,_float>.y;
  auVar28._12_4_ = local_1a8.values[0].super_Tuple3<pbrt::Point3,_float>.y;
  auVar68._4_4_ = local_1a8.values[0].super_Tuple3<pbrt::Point3,_float>.x;
  auVar68._0_4_ = local_1a8.values[0].super_Tuple3<pbrt::Point3,_float>.x;
  auVar68._8_4_ = local_1a8.values[0].super_Tuple3<pbrt::Point3,_float>.x;
  auVar68._12_4_ = local_1a8.values[0].super_Tuple3<pbrt::Point3,_float>.x;
  auVar17 = vbroadcastss_avx512vl
                      (ZEXT416((uint)local_1a8.values[0].super_Tuple3<pbrt::Point3,_float>.z));
  auVar29._4_4_ = fStack_f4;
  auVar29._0_4_ = fStack_f4;
  auVar29._8_4_ = fStack_f4;
  auVar29._12_4_ = fStack_f4;
  auVar65._4_4_ = FStack_f8;
  auVar65._0_4_ = FStack_f8;
  auVar65._8_4_ = FStack_f8;
  auVar65._12_4_ = FStack_f8;
  auVar66._4_4_ = FStack_f0;
  auVar66._0_4_ = FStack_f0;
  auVar66._8_4_ = FStack_f0;
  auVar66._12_4_ = FStack_f0;
  auVar67._4_4_ = fStack_ec;
  auVar67._0_4_ = fStack_ec;
  auVar67._8_4_ = fStack_ec;
  auVar67._12_4_ = fStack_ec;
  bVar9 = false;
  auVar18 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar16 = vinsertps_avx512f(ZEXT416((uint)local_128._4_4_),ZEXT416((uint)IStack_118.high),0x10);
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fStack_104 *
                                          local_1a8.values[0].super_Tuple3<pbrt::Point3,_float>.y)),
                            ZEXT416((uint)FStack_108),auVar68);
  auVar19 = vfmadd231ss_avx512f(auVar19,ZEXT416((uint)FStack_100),auVar17);
  auVar20 = vaddss_avx512f(ZEXT416((uint)fStack_fc),auVar19);
  auVar19 = vmulps_avx512vl(auVar28,auVar16);
  auVar16 = vinsertps_avx512f(ZEXT416((uint)local_128._0_4_),ZEXT416((uint)IStack_118.low),0x10);
  auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fStack_f4 *
                                          local_1a8.values[0].super_Tuple3<pbrt::Point3,_float>.y)),
                            auVar65,auVar68);
  auVar21 = vfmadd213ps_avx512vl(auVar16,auVar68,auVar19);
  auVar19 = vinsertps_avx512f(ZEXT416((uint)local_128._8_4_),ZEXT416((uint)FStack_110),0x10);
  auVar16 = vinsertps_avx(ZEXT416((uint)fStack_11c),ZEXT416((uint)FStack_10c),0x10);
  auVar22 = vfmadd231ss_avx512f(auVar22,auVar66,auVar17);
  auVar19 = vfmadd213ps_avx512vl(auVar19,auVar17,auVar21);
  auVar17 = vmulss_avx512f(ZEXT416((uint)local_128._4_4_),
                           ZEXT416((uint)local_1a8.values[2].super_Tuple3<pbrt::Point3,_float>.y));
  auVar22 = vaddss_avx512f(auVar67,auVar22);
  auVar69._0_4_ = auVar16._0_4_ + auVar19._0_4_;
  auVar69._4_4_ = auVar16._4_4_ + auVar19._4_4_;
  auVar69._8_4_ = auVar16._8_4_ + auVar19._8_4_;
  auVar69._12_4_ = auVar16._12_4_ + auVar19._12_4_;
  auVar16 = vbroadcastss_avx512vl(auVar22);
  auVar35._0_16_ = vdivss_avx512f(auVar20,auVar22);
  vucomiss_avx512f(ZEXT416(0x3f800000));
  auVar19 = vfmadd231ss_avx512f(auVar17,ZEXT416((uint)local_128._0_4_),
                                ZEXT416((uint)local_1a8.values[2].super_Tuple3<pbrt::Point3,_float>.
                                              x));
  auVar16 = vdivps_avx(auVar69,auVar16);
  auVar22 = vfmadd231ss_avx512f(auVar19,ZEXT416((uint)local_128._8_4_),
                                ZEXT416((uint)local_1a8.values[2].super_Tuple3<pbrt::Point3,_float>.
                                              z));
  auVar19 = vinsertps_avx512f(ZEXT416((uint)local_1a8.values[2].super_Tuple3<pbrt::Point3,_float>.y)
                              ,ZEXT416((uint)local_1a8.values[1].super_Tuple3<pbrt::Point3,_float>.y
                                      ),0x10);
  auVar20 = vmulps_avx512vl(auVar29,auVar19);
  auVar21 = vmovddup_avx512vl(auVar19);
  auVar23 = vaddss_avx512f(ZEXT416((uint)fStack_11c),auVar22);
  auVar24 = vmulss_avx512f(ZEXT416((uint)local_128._4_4_),
                           ZEXT416((uint)local_1a8.values[1].super_Tuple3<pbrt::Point3,_float>.y));
  auVar19 = vinsertps_avx512f(ZEXT416((uint)local_1a8.values[2].super_Tuple3<pbrt::Point3,_float>.z)
                              ,ZEXT416((uint)local_1a8.values[1].super_Tuple3<pbrt::Point3,_float>.z
                                      ),0x10);
  uVar14 = vmovlps_avx(auVar16);
  local_1d8.x = (float)uVar14;
  local_1d8.y = SUB84(uVar14,4);
  auVar35._16_48_ = auVar46;
  auVar34._4_60_ = auVar35._4_60_;
  auVar34._0_4_ = auVar35._0_4_;
  auVar17 = auVar34._0_16_;
  local_1d8.z = auVar35._0_4_;
  auVar25 = vmulss_avx512f(ZEXT416((uint)local_128._4_4_),
                           ZEXT416((uint)local_1a8.values[3].super_Tuple3<pbrt::Point3,_float>.y));
  auVar22 = vinsertps_avx512f(ZEXT416((uint)local_1a8.values[2].super_Tuple3<pbrt::Point3,_float>.x)
                              ,ZEXT416((uint)local_1a8.values[1].super_Tuple3<pbrt::Point3,_float>.x
                                      ),0x10);
  auVar24 = vfmadd231ss_avx512f(auVar24,ZEXT416((uint)local_128._0_4_),
                                ZEXT416((uint)local_1a8.values[1].super_Tuple3<pbrt::Point3,_float>.
                                              x));
  auVar20 = vfmadd231ps_avx512vl(auVar20,auVar65,auVar22);
  auVar22 = vmovddup_avx512vl(auVar22);
  auVar25 = vfmadd231ss_avx512f(auVar25,ZEXT416((uint)local_1a8.values[3].
                                                      super_Tuple3<pbrt::Point3,_float>.x),
                                ZEXT416((uint)local_128._0_4_));
  auVar24 = vfmadd231ss_avx512f(auVar24,ZEXT416((uint)local_128._8_4_),
                                ZEXT416((uint)local_1a8.values[1].super_Tuple3<pbrt::Point3,_float>.
                                              z));
  auVar20 = vfmadd231ps_avx512vl(auVar20,auVar66,auVar19);
  auVar25 = vfmadd231ss_avx512f(auVar25,ZEXT416((uint)local_1a8.values[3].
                                                      super_Tuple3<pbrt::Point3,_float>.z),
                                ZEXT416((uint)local_128._8_4_));
  fVar61 = auVar24._0_4_ + fStack_11c;
  auVar20 = vaddps_avx512vl(auVar67,auVar20);
  auVar24 = vmulss_avx512f(ZEXT416((uint)IStack_118.high),
                           ZEXT416((uint)local_1a8.values[3].super_Tuple3<pbrt::Point3,_float>.y));
  auVar26 = vpermt2ps_avx512vl(ZEXT416((uint)IStack_118.high),_DAT_0061ddf0,
                               ZEXT416((uint)fStack_104));
  auVar27 = vmulss_avx512f(ZEXT416((uint)fStack_104),
                           ZEXT416((uint)local_1a8.values[3].super_Tuple3<pbrt::Point3,_float>.y));
  auVar24 = vfmadd231ss_avx512f(auVar24,ZEXT416((uint)local_1a8.values[3].
                                                      super_Tuple3<pbrt::Point3,_float>.x),
                                ZEXT416((uint)IStack_118.low));
  auVar21 = vmulps_avx512vl(auVar26,auVar21);
  auVar26 = vpermt2ps_avx512vl(ZEXT416((uint)IStack_118.low),_DAT_0061ddf0,ZEXT416((uint)FStack_108)
                              );
  uVar13 = vcmpps_avx512vl(auVar20,auVar18,0);
  auVar27 = vfmadd231ss_avx512f(auVar27,ZEXT416((uint)local_1a8.values[3].
                                                      super_Tuple3<pbrt::Point3,_float>.x),
                                ZEXT416((uint)FStack_108));
  bVar7 = (byte)(uVar13 >> 1);
  bVar15 = (byte)uVar13;
  auVar22 = vfmadd213ps_avx512vl(auVar22,auVar26,auVar21);
  auVar21 = vmovshdup_avx512vl(auVar20);
  auVar37._0_16_ = vdivss_avx512f(ZEXT416((uint)fVar61),auVar21);
  auVar21 = vfmadd231ss_avx512f(auVar24,ZEXT416((uint)local_1a8.values[3].
                                                      super_Tuple3<pbrt::Point3,_float>.z),
                                ZEXT416((uint)FStack_110));
  auVar24 = vpermt2ps_avx512vl(ZEXT416((uint)FStack_110),_DAT_0061ddf0,ZEXT416((uint)FStack_100));
  auVar26 = vpermi2ps_avx512vl(_DAT_0061ddf0,ZEXT416((uint)FStack_10c),ZEXT416((uint)fStack_fc));
  auVar27 = vfmadd231ss_avx512f(auVar27,ZEXT416((uint)local_1a8.values[3].
                                                      super_Tuple3<pbrt::Point3,_float>.z),
                                ZEXT416((uint)FStack_100));
  auVar21 = vaddss_avx512f(ZEXT416((uint)FStack_10c),auVar21);
  auVar28 = vmulss_avx512f(auVar29,ZEXT416((uint)local_1a8.values[3].
                                                 super_Tuple3<pbrt::Point3,_float>.y));
  auVar28 = vfmadd231ss_avx512f(auVar28,auVar65,
                                ZEXT416((uint)local_1a8.values[3].super_Tuple3<pbrt::Point3,_float>.
                                              x));
  auVar37._16_48_ = auVar46;
  auVar36._4_60_ = auVar37._4_60_;
  auVar36._0_4_ = (uint)(bVar7 & 1) * (int)fVar61 + (uint)!(bool)(bVar7 & 1) * auVar37._0_4_;
  auVar29 = auVar36._0_16_;
  auVar19 = vmovddup_avx512vl(auVar19);
  auVar28 = vfmadd231ss_avx512f(auVar28,auVar66,
                                ZEXT416((uint)local_1a8.values[3].super_Tuple3<pbrt::Point3,_float>.
                                              z));
  auVar19 = vfmadd213ps_avx512vl(auVar19,auVar24,auVar22);
  fStack_ec = fStack_ec + auVar28._0_4_;
  auVar22 = vaddps_avx512vl(auVar26,auVar19);
  auVar24 = vmovddup_avx512vl(auVar20);
  fVar61 = (fStack_11c + auVar25._0_4_) / fStack_ec;
  fStack_ec = auVar21._0_4_ / fStack_ec;
  auVar43._4_12_ = auVar21._4_12_;
  auVar43._0_4_ = fStack_ec;
  auVar19 = vucomiss_avx512f(ZEXT416(0x3f800000));
  local_1ac = (fStack_fc + auVar27._0_4_) / auVar19._0_4_;
  auVar19 = vdivps_avx512vl(auVar22,auVar24);
  auVar27._0_4_ = (uint)(bVar15 & 1) * auVar22._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar19._0_4_;
  bVar4 = (bool)((bVar15 & 2) >> 1);
  auVar27._4_4_ = (uint)bVar4 * auVar22._4_4_ | (uint)!bVar4 * auVar19._4_4_;
  auVar27._8_4_ = (uint)(bVar15 & 1) * auVar22._8_4_ | (uint)!(bool)(bVar15 & 1) * auVar19._8_4_;
  bVar4 = (bool)((byte)(bVar15 << 2) >> 3 & 1);
  auVar27._12_4_ = (uint)bVar4 * auVar22._12_4_ | (uint)!bVar4 * auVar19._12_4_;
  auVar39._0_16_ = vdivss_avx512f(auVar23,auVar20);
  auVar19 = vinsertps_avx512f(auVar29,auVar27,0xdc);
  local_1cc = vmovlps_avx512f(auVar19);
  local_1c4 = vextractps_avx(auVar27,1);
  auVar39._16_48_ = auVar46;
  auVar38._4_60_ = auVar39._4_60_;
  auVar38._0_4_ = (uint)(bVar15 & 1) * auVar23._0_4_ + (uint)!(bool)(bVar15 & 1) * auVar39._0_4_;
  auVar20 = auVar38._0_16_;
  auVar41._16_48_ = auVar46;
  auVar41._0_16_ = ZEXT416((uint)fVar61);
  auVar40._4_60_ = auVar41._4_60_;
  auVar40._0_4_ = fVar61;
  auVar21 = auVar40._0_16_;
  auVar43._16_48_ = auVar46;
  auVar42._4_60_ = auVar43._4_60_;
  auVar42._0_4_ = fStack_ec;
  auVar22 = vunpcklps_avx512vl(auVar20,auVar27);
  auVar45._16_48_ = auVar46;
  auVar45._0_16_ = ZEXT416((uint)local_1ac);
  auVar44._4_60_ = auVar45._4_60_;
  auVar44._0_4_ = local_1ac;
  auVar19 = vinsertps_avx(auVar21,auVar42._0_16_,0x10);
  local_1c0 = vmovlps_avx512f(auVar22);
  local_1b8 = vextractps_avx(auVar27,2);
  auVar23 = vminss_avx512f(auVar21,auVar20);
  local_1b4 = vmovlps_avx(auVar19);
  pCVar3 = this->common;
  uVar13._0_4_ = this->uMin;
  uVar13._4_4_ = this->uMax;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar13;
  fVar61 = pCVar3->width[1];
  fVar53 = pCVar3->width[0];
  auVar52._4_4_ = fVar53;
  auVar52._0_4_ = fVar53;
  auVar52._8_4_ = fVar53;
  auVar52._12_4_ = fVar53;
  auVar19 = vsubps_avx512vl(auVar18,auVar58);
  auVar59._0_4_ = fVar61 * (float)(undefined4)uVar13;
  auVar59._4_4_ = fVar61 * (float)uVar13._4_4_;
  auVar59._8_4_ = fVar61 * 0.0;
  auVar59._12_4_ = fVar61 * 0.0;
  auVar22 = vfmadd231ps_fma(auVar59,auVar52,auVar19);
  auVar19 = vmovshdup_avx(auVar22);
  auVar19 = vmaxss_avx(auVar19,auVar22);
  fVar47 = auVar19._0_4_ * 0.5;
  auVar19 = vminss_avx512f(auVar29,auVar16);
  auVar19 = vminss_avx(auVar23,auVar19);
  if (auVar19._0_4_ - fVar47 <= 0.0) {
    auVar19 = vmaxss_avx512f(auVar29,auVar16);
    auVar22 = vmaxss_avx512f(auVar21,auVar20);
    auVar19 = vmaxss_avx(auVar22,auVar19);
    if (0.0 <= fVar47 + auVar19._0_4_) {
      auVar19 = vmovlhps_avx(auVar42._0_16_,auVar16);
      auVar19 = vinsertps_avx(auVar19,auVar17,0x10);
      auVar18 = vinsertps_avx(auVar19,auVar44._0_16_,0x20);
      auVar19 = vblendps_avx(auVar18,auVar27,10);
      auVar22 = vfmadd231ss_fma(ZEXT416((uint)(local_200.d.super_Tuple3<pbrt::Vector3,_float>.y *
                                              local_200.d.super_Tuple3<pbrt::Vector3,_float>.y)),
                                ZEXT416((uint)local_200.d.super_Tuple3<pbrt::Vector3,_float>.x),
                                ZEXT416((uint)local_200.d.super_Tuple3<pbrt::Vector3,_float>.x));
      auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)local_200.d.super_Tuple3<pbrt::Vector3,_float>
                                                      .z),
                                ZEXT416((uint)local_200.d.super_Tuple3<pbrt::Vector3,_float>.z));
      auVar22 = vsqrtss_avx(auVar22,auVar22);
      fVar5 = auVar22._0_4_ * tMax;
      auVar62._4_4_ = fVar5;
      auVar62._0_4_ = fVar5;
      auVar62._8_4_ = fVar5;
      auVar62._12_4_ = fVar5;
      auVar22 = vblendps_avx(auVar62,ZEXT816(0),0xd);
      uVar13 = vcmpps_avx512vl(ZEXT416((uint)fVar5),auVar22,1);
      auVar20 = vinsertps_avx(auVar27,auVar17,0x10);
      auVar20 = vinsertps_avx(auVar20,auVar16,0x70);
      auVar30._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * (int)fVar5;
      auVar30._0_4_ = (uint)((byte)uVar13 & 1) * (int)fVar5;
      auVar30._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * (int)fVar5;
      auVar30._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * (int)fVar5;
      uVar13 = vcmpps_avx512vl(auVar18,auVar27,1);
      auVar21 = vblendmps_avx512vl(auVar20,auVar19);
      bVar4 = (bool)((byte)uVar13 & 1);
      auVar31._0_4_ = (uint)bVar4 * auVar21._0_4_ | (uint)!bVar4 * auVar22._0_4_;
      bVar4 = (bool)((byte)(uVar13 >> 1) & 1);
      auVar31._4_4_ = (uint)bVar4 * auVar21._4_4_ | (uint)!bVar4 * auVar22._4_4_;
      bVar4 = (bool)((byte)(uVar13 >> 2) & 1);
      auVar31._8_4_ = (uint)bVar4 * auVar21._8_4_ | (uint)!bVar4 * auVar22._8_4_;
      bVar4 = (bool)((byte)(uVar13 >> 3) & 1);
      auVar31._12_4_ = (uint)bVar4 * auVar21._12_4_ | (uint)!bVar4 * auVar22._12_4_;
      uVar13 = vcmpps_avx512vl(auVar27,auVar18,1);
      bVar4 = (bool)((byte)uVar13 & 1);
      auVar32._0_4_ = (uint)bVar4 * auVar19._0_4_ | (uint)!bVar4 * auVar20._0_4_;
      bVar4 = (bool)((byte)(uVar13 >> 1) & 1);
      auVar32._4_4_ = (uint)bVar4 * auVar19._4_4_ | (uint)!bVar4 * auVar20._4_4_;
      bVar4 = (bool)((byte)(uVar13 >> 2) & 1);
      auVar32._8_4_ = (uint)bVar4 * auVar19._8_4_ | (uint)!bVar4 * auVar20._8_4_;
      bVar4 = (bool)((byte)(uVar13 >> 3) & 1);
      auVar32._12_4_ = (uint)bVar4 * auVar19._12_4_ | (uint)!bVar4 * auVar20._12_4_;
      auVar22 = vshufps_avx(auVar32,auVar32,0x1b);
      uVar13 = vcmpps_avx512vl(auVar31,auVar22,1);
      auVar19 = vblendps_avx(auVar31,auVar22,10);
      auVar22 = vblendps_avx(auVar22,auVar31,10);
      bVar4 = (bool)((byte)uVar13 & 1);
      auVar33._0_4_ = (float)((uint)bVar4 * auVar19._0_4_ | (uint)!bVar4 * auVar22._0_4_);
      bVar4 = (bool)((byte)(uVar13 >> 1) & 1);
      auVar33._4_4_ = (float)((uint)bVar4 * auVar19._4_4_ | (uint)!bVar4 * auVar22._4_4_);
      bVar4 = (bool)((byte)(uVar13 >> 2) & 1);
      auVar33._8_4_ = (float)((uint)bVar4 * auVar19._8_4_ | (uint)!bVar4 * auVar22._8_4_);
      bVar4 = (bool)((byte)(uVar13 >> 3) & 1);
      auVar33._12_4_ = (float)((uint)bVar4 * auVar19._12_4_ | (uint)!bVar4 * auVar22._12_4_);
      auVar55._4_4_ = fVar47;
      auVar55._0_4_ = fVar47;
      auVar55._8_4_ = fVar47;
      auVar55._12_4_ = fVar47;
      auVar19 = vsubps_avx(auVar33,auVar55);
      auVar54._0_4_ = auVar33._0_4_ + fVar47;
      auVar54._4_4_ = auVar33._4_4_ + fVar47;
      auVar54._8_4_ = auVar33._8_4_ + fVar47;
      auVar54._12_4_ = auVar33._12_4_ + fVar47;
      auVar22 = vpshufb_avx(auVar30,_DAT_0061de00);
      auVar19 = vblendps_avx(auVar19,auVar54,10);
      uVar14 = vcmpps_avx512vl(auVar19,auVar22,2);
      uVar6 = vcmpps_avx512vl(auVar22,auVar19,2);
      auVar19 = vpmovm2d_avx512vl(uVar6);
      auVar22 = vpmovm2d_avx512vl(uVar14);
      auVar19 = vpblendd_avx2(auVar22,auVar19,10);
      uVar14 = vpmovd2m_avx512vl(auVar19);
      if ((~(ushort)uVar14 & 0xf) == 0) {
        auVar56._8_4_ = 0xc0000000;
        auVar56._0_8_ = 0xc0000000c0000000;
        auVar56._12_4_ = 0xc0000000;
        auVar60._8_4_ = 0x7fffffff;
        auVar60._0_8_ = 0x7fffffff7fffffff;
        auVar60._12_4_ = 0x7fffffff;
        auVar19 = (undefined1  [16])0x0;
        uVar13 = 0;
        bVar4 = true;
        do {
          bVar9 = bVar4;
          uVar12 = uVar13 | 2;
          auVar64._8_8_ = 0;
          auVar64._0_8_ = *(ulong *)((long)&local_1cc + uVar13 * 0xc);
          lVar8 = uVar13 * 3;
          uVar1 = (&local_1d8)[uVar12].x;
          uVar2 = (&local_1d8)[uVar12].y;
          auVar16 = vfmadd231ps_fma(auVar16,auVar64,auVar56);
          auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((&local_1c4)[lVar8]),
                                    SUB6416(ZEXT464(0xc0000000),0));
          uVar13 = 1;
          auVar51._0_4_ = (float)uVar1 + auVar16._0_4_;
          auVar51._4_4_ = (float)uVar2 + auVar16._4_4_;
          auVar51._8_4_ = auVar16._8_4_ + 0.0;
          auVar51._12_4_ = auVar16._12_4_ + 0.0;
          auVar16 = vandps_avx(auVar51,auVar60);
          auVar22 = vshufps_avx(auVar16,auVar16,0xf5);
          auVar22 = vmaxss_avx(auVar22,auVar16);
          auVar16 = vandps_avx(ZEXT416((uint)(auVar17._0_4_ + (&local_1d8)[uVar12].z)),auVar60);
          auVar16 = vmaxss_avx(auVar16,auVar22);
          auVar19 = vmaxss_avx(auVar16,auVar19);
          auVar17 = ZEXT416((&local_1c4)[lVar8]);
          auVar16 = auVar64;
          bVar4 = false;
        } while (bVar9);
        pFVar11 = pCVar3->width;
        if (fVar53 < fVar61) {
          pFVar11 = pCVar3->width + 1;
        }
        iVar10 = Log2Int((auVar19._0_4_ * 8.485281) / (*pFVar11 * 0.05 * 8.0));
        local_68[1] = (Float)local_128._4_4_;
        local_68[0] = (Float)local_128._0_4_;
        aFStack_60[1] = fStack_11c;
        aFStack_60[0] = (Float)local_128._8_4_;
        depth = 10;
        if ((uint)(iVar10 / 2) < 10) {
          depth = iVar10 / 2;
        }
        if (iVar10 < -1) {
          depth = 0;
        }
        local_a8._16_4_ = IStack_d8.low;
        local_a8._20_4_ = IStack_d8.high;
        aFStack_90[0] = aFStack_d0[0];
        aFStack_90[1] = aFStack_d0[1];
        aFStack_88[0] = aFStack_c8[0];
        aFStack_88[1] = aFStack_c8[1];
        aFStack_80[0] = aFStack_c0[0];
        aFStack_80[1] = aFStack_c0[1];
        aFStack_78[0] = aFStack_b8[0];
        aFStack_78[1] = aFStack_b8[1];
        aFStack_70[0] = aFStack_b0[0];
        aFStack_70[1] = aFStack_b0[1];
        cp_01.n = 4;
        cp_01.ptr = (Point3<float> *)&local_1d8;
        bVar9 = RecursiveIntersect(this,&local_200,tMax,cp_01,(Transform *)local_a8,this->uMin,
                                   this->uMax,depth,si);
      }
      else {
        bVar9 = false;
      }
    }
  }
  return bVar9;
}

Assistant:

bool Curve::IntersectRay(const Ray &r, Float tMax,
                         pstd::optional<ShapeIntersection> *si) const {
#ifndef PBRT_IS_GPU_CODE
    ++nCurveTests;
#endif
    // Transform _Ray_ to curve's object space
    Ray ray = (*common->objectFromRender)(r);

    // Get object-space control points for curve segment, _cpObj_
    pstd::array<Point3f, 4> cpObj =
        CubicBezierControlPoints(pstd::span<const Point3f>(common->cpObj), uMin, uMax);

    // Project curve control points to plane perpendicular to ray
    Vector3f dx = Cross(ray.d, cpObj[3] - cpObj[0]);
    if (LengthSquared(dx) == 0) {
        Vector3f dy;
        CoordinateSystem(ray.d, &dx, &dy);
    }
    Transform rayFromObject = LookAt(ray.o, ray.o + ray.d, dx);
    pstd::array<Point3f, 4> cp = {rayFromObject(cpObj[0]), rayFromObject(cpObj[1]),
                                  rayFromObject(cpObj[2]), rayFromObject(cpObj[3])};

    // Test ray against bound of projected control points
    Float maxWidth = std::max(Lerp(uMin, common->width[0], common->width[1]),
                              Lerp(uMax, common->width[0], common->width[1]));
    Bounds3f curveBounds = Union(Bounds3f(cp[0], cp[1]), Bounds3f(cp[2], cp[3]));
    curveBounds = Expand(curveBounds, 0.5f * maxWidth);
    Bounds3f rayBounds(Point3f(0, 0, 0), Point3f(0, 0, Length(ray.d) * tMax));
    if (!Overlaps(rayBounds, curveBounds))
        return false;

    // Compute refinement depth for curve, _maxDepth_
    Float L0 = 0;
    for (int i = 0; i < 2; ++i)
        L0 = std::max(
            L0, std::max(std::max(std::abs(cp[i].x - 2 * cp[i + 1].x + cp[i + 2].x),
                                  std::abs(cp[i].y - 2 * cp[i + 1].y + cp[i + 2].y)),
                         std::abs(cp[i].z - 2 * cp[i + 1].z + cp[i + 2].z)));

    Float eps = std::max(common->width[0], common->width[1]) * .05f;  // width / 20
    // Compute log base 4 by dividing log2 in half.
    int r0 = Log2Int(1.41421356237f * 6.f * L0 / (8.f * eps)) / 2;
    int maxDepth = Clamp(r0, 0, 10);

    // Recursively test for ray--curve intersection
    pstd::span<const Point3f> cpSpan(cp);
    return RecursiveIntersect(ray, tMax, cpSpan, Inverse(rayFromObject), uMin, uMax,
                              maxDepth, si);
}